

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O2

Div_Type_t Bmc_FxDivOr(int LitA,int LitB,int *pLits,int *pPhase)

{
  int iVar1;
  int iVar2;
  Div_Type_t DVar3;
  
  if (LitA != LitB) {
    iVar1 = Abc_Lit2Var(LitA);
    iVar2 = Abc_Lit2Var(LitB);
    DVar3 = DIV_CST;
    if (iVar1 != iVar2) {
      iVar1 = LitB;
      if (LitB < LitA) {
        iVar1 = LitA;
      }
      if (LitA < LitB) {
        LitB = LitA;
      }
      iVar2 = Abc_LitNot(LitB);
      *pLits = iVar2;
      iVar1 = Abc_LitNot(iVar1);
      pLits[1] = iVar1;
      *pPhase = 1;
      DVar3 = DIV_AND;
    }
    return DVar3;
  }
  __assert_fail("LitA != LitB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                ,0xb1,"Div_Type_t Bmc_FxDivOr(int, int, int *, int *)");
}

Assistant:

static inline Div_Type_t Bmc_FxDivOr( int LitA, int LitB, int * pLits, int * pPhase )
{
    assert( LitA != LitB );
    if ( Abc_Lit2Var(LitA) == Abc_Lit2Var(LitB) )
        return DIV_CST;
    if ( LitA > LitB )
        ABC_SWAP( int, LitA, LitB );
    pLits[0] = Abc_LitNot(LitA);
    pLits[1] = Abc_LitNot(LitB);
    *pPhase = 1;
    return DIV_AND;
}